

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::to_non_uniform_aware_expression_abi_cxx11_
          (CompilerGLSL *this,uint32_t id)

{
  bool bVar1;
  uint32_t in_EDX;
  undefined4 in_register_00000034;
  CompilerGLSL *this_00;
  ID local_24;
  undefined1 local_1d;
  uint32_t local_1c;
  CompilerGLSL *pCStack_18;
  uint32_t id_local;
  CompilerGLSL *this_local;
  string *expr;
  
  this_00 = (CompilerGLSL *)CONCAT44(in_register_00000034,id);
  local_1d = 0;
  local_1c = in_EDX;
  pCStack_18 = this_00;
  this_local = this;
  to_expression_abi_cxx11_(this,id,SUB41(in_EDX,0));
  TypedID<(spirv_cross::Types)0>::TypedID(&local_24,local_1c);
  bVar1 = Compiler::has_decoration((Compiler *)this_00,local_24,DecorationNonUniform);
  if (bVar1) {
    convert_non_uniform_expression(this_00,(string *)this,local_1c);
  }
  return this;
}

Assistant:

string CompilerGLSL::to_non_uniform_aware_expression(uint32_t id)
{
	string expr = to_expression(id);

	if (has_decoration(id, DecorationNonUniform))
		convert_non_uniform_expression(expr, id);

	return expr;
}